

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ushort **ppuVar5;
  ulong uVar6;
  ptrdiff_t *ppVar7;
  char *pcVar8;
  lua_State *L;
  byte *s_00;
  byte *pbVar9;
  bool bVar10;
  char *local_48;
  
LAB_0011294a:
  do {
    while (bVar1 = *p, bVar1 != 0x25) {
      if (bVar1 < 0x28) {
        if (bVar1 == 0) {
          return (char *)(byte *)s;
        }
        if ((bVar1 == 0x24) && (((byte *)p)[1] == 0)) {
          if (s == ms->src_end) {
            return (char *)(byte *)s;
          }
          return (char *)0x0;
        }
      }
      else {
        if (bVar1 == 0x29) {
          uVar6 = (ulong)(uint)ms->level;
          ppVar7 = &ms->capture[uVar6 - 1].len;
          while (0 < (int)uVar6) {
            uVar6 = uVar6 - 1;
            lVar2 = *ppVar7;
            ppVar7 = ppVar7 + -2;
            if (lVar2 == -1) {
              uVar6 = uVar6 & 0xffffffff;
              ms->capture[uVar6].len = (long)s - (long)ms->capture[uVar6].init;
              pcVar8 = match(ms,s,(char *)((byte *)p + 1));
              if (pcVar8 == (char *)0x0) {
                ms->capture[uVar6].len = -1;
              }
              return pcVar8;
            }
          }
          L = ms->L;
          pcVar8 = "invalid pattern capture";
LAB_00112d43:
          luaL_error(L,pcVar8);
        }
        if (bVar1 == 0x28) {
          if (((byte *)p)[1] == 0x29) {
            pbVar9 = (byte *)p + 2;
            iVar3 = -2;
          }
          else {
            pbVar9 = (byte *)p + 1;
            iVar3 = -1;
          }
          pcVar8 = start_capture(ms,s,(char *)pbVar9,iVar3);
          return pcVar8;
        }
      }
LAB_00112aa1:
      pbVar9 = (byte *)classend(ms,p);
      if (s < ms->src_end) {
        iVar3 = singlematch((uint)(byte)*s,p,(char *)pbVar9);
        bVar10 = iVar3 != 0;
      }
      else {
        bVar10 = false;
      }
      bVar1 = *pbVar9;
      if (bVar1 < 0x2d) {
        if (bVar1 == 0x2a) {
          local_48 = max_expand(ms,s,p,(char *)pbVar9);
LAB_00112b97:
          bVar10 = true;
        }
        else {
          if (bVar1 == 0x2b) {
            if (bVar10) {
              pcVar8 = max_expand(ms,(char *)((byte *)s + 1),p,(char *)pbVar9);
              goto LAB_00112bb9;
            }
          }
          else {
LAB_00112b75:
            if (bVar10) {
              s = (char *)((byte *)s + 1);
              goto LAB_00112c01;
            }
          }
          bVar10 = true;
          local_48 = (char *)0x0;
        }
      }
      else {
        if (bVar1 != 0x3f) {
          if (bVar1 != 0x2d) goto LAB_00112b75;
          s_00 = (byte *)s;
          do {
            pcVar8 = match(ms,(char *)s_00,(char *)(pbVar9 + 1));
            if (pcVar8 == (char *)0x0) {
              if ((s_00 < ms->src_end) &&
                 (iVar3 = singlematch((uint)*s_00,p,(char *)pbVar9), iVar3 != 0)) {
                s_00 = s_00 + 1;
                bVar10 = true;
              }
              else {
                local_48 = (char *)0x0;
                bVar10 = false;
              }
            }
            else {
              bVar10 = false;
              local_48 = pcVar8;
            }
          } while (bVar10);
          goto LAB_00112b97;
        }
        if ((bVar10) &&
           (pcVar8 = match(ms,(char *)((byte *)s + 1),(char *)(pbVar9 + 1)), pcVar8 != (char *)0x0))
        {
LAB_00112bb9:
          bVar10 = true;
          local_48 = pcVar8;
        }
        else {
          pbVar9 = pbVar9 + 1;
LAB_00112c01:
          bVar10 = false;
          p = (char *)pbVar9;
        }
      }
      if (bVar10) {
        return local_48;
      }
    }
    bVar1 = ((byte *)p)[1];
    if ((ulong)bVar1 != 0x66) {
      if (bVar1 == 0x62) {
        bVar1 = ((byte *)p)[2];
        if ((bVar1 == 0) || (((byte *)p)[3] == 0)) {
          L = ms->L;
          pcVar8 = "unbalanced pattern";
          goto LAB_00112d43;
        }
        if (*s == bVar1) {
          pbVar9 = (byte *)s + 1;
          if (pbVar9 < ms->src_end) {
            iVar3 = 1;
            do {
              if (*pbVar9 == ((byte *)p)[3]) {
                iVar3 = iVar3 + -1;
                if (iVar3 == 0) {
                  s = (char *)(pbVar9 + 1);
                  goto LAB_00112a7b;
                }
              }
              else {
                iVar3 = iVar3 + (uint)(*pbVar9 == bVar1);
              }
              pbVar9 = pbVar9 + 1;
            } while (pbVar9 != (byte *)ms->src_end);
          }
        }
        s = (char *)0x0;
LAB_00112a7b:
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        p = (char *)((byte *)p + 4);
      }
      else {
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 8) == 0) goto LAB_00112aa1;
        if (((bVar1 < 0x31) || (uVar4 = bVar1 - 0x31, ms->level <= (int)uVar4)) ||
           (ms->capture[uVar4].len == -1)) {
          L = ms->L;
          pcVar8 = "invalid capture index";
          goto LAB_00112d43;
        }
        uVar6 = ms->capture[uVar4].len;
        if ((ulong)((long)ms->src_end - (long)s) < uVar6) {
          s = (char *)0x0;
        }
        else {
          iVar3 = bcmp(ms->capture[uVar4].init,s,uVar6);
          s = (char *)((byte *)s + uVar6);
          if (iVar3 != 0) {
            s = (char *)0x0;
          }
        }
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        p = (char *)((byte *)p + 2);
      }
      goto LAB_0011294a;
    }
    if (((byte *)p)[2] != 0x5b) {
      L = ms->L;
      pcVar8 = "missing \'[\' after \'%%f\' in pattern";
      goto LAB_00112d43;
    }
    pbVar9 = (byte *)p + 2;
    p = classend(ms,(char *)pbVar9);
    if (s == ms->src_init) {
      uVar4 = 0;
    }
    else {
      uVar4 = (uint)((byte *)s)[-1];
    }
    iVar3 = matchbracketclass(uVar4,(char *)pbVar9,(char *)((byte *)p + -1));
    bVar10 = true;
    if ((iVar3 == 0) &&
       (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar9,(char *)((byte *)p + -1)),
       iVar3 != 0)) {
      bVar10 = false;
    }
    else {
      local_48 = (char *)0x0;
      p = (char *)pbVar9;
    }
    if (bVar10) {
      return local_48;
    }
  } while( true );
}

Assistant:

static const char*match(MatchState*ms,const char*s,const char*p){
init:
switch(*p){
case'(':{
if(*(p+1)==')')
return start_capture(ms,s,p+2,(-2));
else
return start_capture(ms,s,p+1,(-1));
}
case')':{
return end_capture(ms,s,p+1);
}
case'%':{
switch(*(p+1)){
case'b':{
s=matchbalance(ms,s,p+2);
if(s==NULL)return NULL;
p+=4;goto init;
}
case'f':{
const char*ep;char previous;
p+=2;
if(*p!='[')
luaL_error(ms->L,"missing "LUA_QL("[")" after "
LUA_QL("%%f")" in pattern");
ep=classend(ms,p);
previous=(s==ms->src_init)?'\0':*(s-1);
if(matchbracketclass(uchar(previous),p,ep-1)||
!matchbracketclass(uchar(*s),p,ep-1))return NULL;
p=ep;goto init;
}
default:{
if(isdigit(uchar(*(p+1)))){
s=match_capture(ms,s,uchar(*(p+1)));
if(s==NULL)return NULL;
p+=2;goto init;
}
goto dflt;
}
}
}
case'\0':{
return s;
}
case'$':{
if(*(p+1)=='\0')
return(s==ms->src_end)?s:NULL;
else goto dflt;
}
default:dflt:{
const char*ep=classend(ms,p);
int m=s<ms->src_end&&singlematch(uchar(*s),p,ep);
switch(*ep){
case'?':{
const char*res;
if(m&&((res=match(ms,s+1,ep+1))!=NULL))
return res;
p=ep+1;goto init;
}
case'*':{
return max_expand(ms,s,p,ep);
}
case'+':{
return(m?max_expand(ms,s+1,p,ep):NULL);
}
case'-':{
return min_expand(ms,s,p,ep);
}
default:{
if(!m)return NULL;
s++;p=ep;goto init;
}
}
}
}
}